

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O0

void dradf4(int ido,int l1,float *cc,float *ch,float *wa1,float *wa2,float *wa3)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float tr4;
  float tr3;
  float tr2;
  float tr1;
  float ti4;
  float ti3;
  float ti2;
  float ti1;
  float cr4;
  float cr3;
  float cr2;
  float ci4;
  float ci3;
  float ci2;
  int t6;
  int t5;
  int t4;
  int t3;
  int t2;
  int t1;
  int t0;
  int k;
  int i;
  float *wa2_local;
  float *wa1_local;
  float *ch_local;
  float *cc_local;
  int l1_local;
  int ido_local;
  
  iVar1 = l1 * ido;
  t6 = iVar1 * 2;
  t4 = iVar1 * 3;
  t5 = 0;
  t3 = iVar1;
  for (t1 = 0; t1 < l1; t1 = t1 + 1) {
    fVar13 = cc[t3];
    fVar14 = cc[t4];
    fVar10 = cc[t5];
    fVar11 = cc[t6];
    iVar5 = t5 * 4;
    ch[iVar5] = fVar13 + fVar14 + fVar10 + fVar11;
    ch[ido * 4 + iVar5 + -1] = (fVar10 + fVar11) - (fVar13 + fVar14);
    iVar5 = ido * 2 + iVar5;
    ch[iVar5 + -1] = cc[t5] - cc[t6];
    ch[iVar5] = cc[t4] - cc[t3];
    t3 = ido + t3;
    t4 = ido + t4;
    t5 = ido + t5;
    t6 = ido + t6;
  }
  if (1 < ido) {
    if (ido != 2) {
      t3 = 0;
      for (t1 = 0; t1 < l1; t1 = t1 + 1) {
        t4 = t3;
        iVar5 = ido * 2;
        ci2 = (float)(iVar5 + t3 * 4);
        t6 = t3 * 4;
        for (t0 = 2; t0 < ido; t0 = t0 + 2) {
          iVar2 = t4 + 2;
          iVar3 = t6 + 2;
          fVar13 = (float)((int)ci2 + -2);
          iVar4 = iVar1 + iVar2;
          fVar14 = wa1[t0 + -2] * cc[iVar4 + -1] + wa1[t0 + -1] * cc[iVar4];
          fVar6 = wa1[t0 + -2] * cc[iVar4] + -(wa1[t0 + -1] * cc[iVar4 + -1]);
          iVar4 = iVar1 + iVar4;
          fVar7 = wa2[t0 + -2] * cc[iVar4 + -1] + wa2[t0 + -1] * cc[iVar4];
          fVar8 = wa2[t0 + -2] * cc[iVar4] + -(wa2[t0 + -1] * cc[iVar4 + -1]);
          iVar4 = iVar1 + iVar4;
          fVar9 = wa3[t0 + -2] * cc[iVar4 + -1] + wa3[t0 + -1] * cc[iVar4];
          fVar10 = wa3[t0 + -2] * cc[iVar4] + -(wa3[t0 + -1] * cc[iVar4 + -1]);
          fVar11 = fVar14 + fVar9;
          fVar9 = fVar9 - fVar14;
          fVar14 = fVar6 + fVar10;
          fVar6 = fVar6 - fVar10;
          fVar10 = cc[iVar2] + fVar8;
          fVar8 = cc[iVar2] - fVar8;
          fVar12 = cc[t4 + 1] + fVar7;
          fVar7 = cc[t4 + 1] - fVar7;
          ch[t6 + 1] = fVar11 + fVar12;
          ch[iVar3] = fVar14 + fVar10;
          ch[(int)ci2 + -3] = fVar7 - fVar6;
          ch[(int)fVar13] = fVar9 - fVar8;
          ch[iVar3 + iVar5 + -1] = fVar6 + fVar7;
          ch[iVar3 + iVar5] = fVar9 + fVar8;
          ch[(int)fVar13 + iVar5 + -1] = fVar12 - fVar11;
          ch[(int)fVar13 + iVar5] = fVar14 - fVar10;
          ci2 = fVar13;
          t6 = iVar3;
          t4 = iVar2;
        }
        t3 = ido + t3;
      }
      if ((ido & 1U) != 0) {
        return;
      }
    }
    t3 = iVar1 + ido + -1;
    t4 = t3 + iVar1 * 2;
    ci3 = (float)ido;
    t6 = ido;
    for (t1 = 0; t1 < l1; t1 = t1 + 1) {
      fVar13 = -dradf4::hsqt2 * (cc[t3] + cc[t4]);
      fVar14 = dradf4::hsqt2 * (cc[t3] - cc[t4]);
      ch[t6 + -1] = fVar14 + cc[(int)ci3 + -1];
      ch[t6 + ido * 2 + -1] = cc[(int)ci3 + -1] - fVar14;
      ch[t6] = fVar13 - cc[t3 + iVar1];
      ch[t6 + ido * 2] = fVar13 + cc[t3 + iVar1];
      t3 = ido + t3;
      t4 = ido + t4;
      t6 = ido * 4 + t6;
      ci3 = (float)(ido + (int)ci3);
    }
  }
  return;
}

Assistant:

static void dradf4(int ido,int l1,float *cc,float *ch,float *wa1,
            float *wa2,float *wa3){
  static float hsqt2 = .70710678118654752f;
  int i,k,t0,t1,t2,t3,t4,t5,t6;
  float ci2,ci3,ci4,cr2,cr3,cr4,ti1,ti2,ti3,ti4,tr1,tr2,tr3,tr4;
  t0=l1*ido;

  t1=t0;
  t4=t1<<1;
  t2=t1+(t1<<1);
  t3=0;

  for(k=0;k<l1;k++){
    tr1=cc[t1]+cc[t2];
    tr2=cc[t3]+cc[t4];

    ch[t5=t3<<2]=tr1+tr2;
    ch[(ido<<2)+t5-1]=tr2-tr1;
    ch[(t5+=(ido<<1))-1]=cc[t3]-cc[t4];
    ch[t5]=cc[t2]-cc[t1];

    t1+=ido;
    t2+=ido;
    t3+=ido;
    t4+=ido;
  }

  if(ido<2)return;
  if(ido==2)goto L105;


  t1=0;
  for(k=0;k<l1;k++){
    t2=t1;
    t4=t1<<2;
    t5=(t6=ido<<1)+t4;
    for(i=2;i<ido;i+=2){
      t3=(t2+=2);
      t4+=2;
      t5-=2;

      t3+=t0;
      cr2=wa1[i-2]*cc[t3-1]+wa1[i-1]*cc[t3];
      ci2=wa1[i-2]*cc[t3]-wa1[i-1]*cc[t3-1];
      t3+=t0;
      cr3=wa2[i-2]*cc[t3-1]+wa2[i-1]*cc[t3];
      ci3=wa2[i-2]*cc[t3]-wa2[i-1]*cc[t3-1];
      t3+=t0;
      cr4=wa3[i-2]*cc[t3-1]+wa3[i-1]*cc[t3];
      ci4=wa3[i-2]*cc[t3]-wa3[i-1]*cc[t3-1];

      tr1=cr2+cr4;
      tr4=cr4-cr2;
      ti1=ci2+ci4;
      ti4=ci2-ci4;

      ti2=cc[t2]+ci3;
      ti3=cc[t2]-ci3;
      tr2=cc[t2-1]+cr3;
      tr3=cc[t2-1]-cr3;

      ch[t4-1]=tr1+tr2;
      ch[t4]=ti1+ti2;

      ch[t5-1]=tr3-ti4;
      ch[t5]=tr4-ti3;

      ch[t4+t6-1]=ti4+tr3;
      ch[t4+t6]=tr4+ti3;

      ch[t5+t6-1]=tr2-tr1;
      ch[t5+t6]=ti1-ti2;
    }
    t1+=ido;
  }
  if(ido&1)return;

 L105:

  t2=(t1=t0+ido-1)+(t0<<1);
  t3=ido<<2;
  t4=ido;
  t5=ido<<1;
  t6=ido;

  for(k=0;k<l1;k++){
    ti1=-hsqt2*(cc[t1]+cc[t2]);
    tr1=hsqt2*(cc[t1]-cc[t2]);

    ch[t4-1]=tr1+cc[t6-1];
    ch[t4+t5-1]=cc[t6-1]-tr1;

    ch[t4]=ti1-cc[t1+t0];
    ch[t4+t5]=ti1+cc[t1+t0];

    t1+=ido;
    t2+=ido;
    t4+=t3;
    t6+=ido;
  }
}